

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

uint8_t * __thiscall
MPEGSequenceHeader::deserializeDisplayExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uint8_t *puVar4;
  BitStreamReader *bitReader_local;
  MPEGSequenceHeader *this_local;
  
  uVar1 = BitStreamReader::getBits<unsigned_char>(bitReader,3);
  this->video_format = uVar1;
  bVar2 = BitStreamReader::getBit(bitReader);
  if (bVar2) {
    uVar1 = BitStreamReader::getBits<unsigned_char>(bitReader,8);
    this->color_primaries = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(bitReader,8);
    this->transfer_characteristics = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(bitReader,8);
    this->matrix_coefficients = uVar1;
  }
  uVar3 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_width = uVar3 << 4;
  BitStreamReader::skipBit(bitReader);
  uVar3 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_height = uVar3 << 4;
  BitStreamReader::skipBit(bitReader);
  puVar4 = MPEGHeader::skipProcessedBytes(bitReader);
  return puVar4;
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeDisplayExtension(BitStreamReader& bitReader)
{
    // MpegEncContext *s= &s1->mpeg_enc_ctx;
    video_format = bitReader.getBits<uint8_t>(3); /* video format */

    if (bitReader.getBit())  // color_description
    {
        color_primaries = bitReader.getBits<uint8_t>(8);          /* color primaries */
        transfer_characteristics = bitReader.getBits<uint8_t>(8); /* transfer_characteristics */
        matrix_coefficients = bitReader.getBits<uint8_t>(8);      /* matrix_coefficients */
    }

    pan_scan_width = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker
    pan_scan_height = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}